

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O0

void __thiscall ClosedFileInputSource::after(ClosedFileInputSource *this)

{
  int iVar1;
  element_type *peVar2;
  qpdf_offset_t qVar3;
  undefined4 extraout_var;
  shared_ptr<FileInputSource> local_20;
  ClosedFileInputSource *local_10;
  ClosedFileInputSource *this_local;
  
  local_10 = this;
  peVar2 = std::__shared_ptr_access<FileInputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileInputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->fis);
  qVar3 = InputSource::getLastOffset(&peVar2->super_InputSource);
  (this->super_InputSource).last_offset = qVar3;
  peVar2 = std::__shared_ptr_access<FileInputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileInputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->fis);
  iVar1 = (*(peVar2->super_InputSource)._vptr_InputSource[4])();
  this->offset = CONCAT44(extraout_var,iVar1);
  if ((this->stay_open & 1U) == 0) {
    std::shared_ptr<FileInputSource>::shared_ptr(&local_20,(nullptr_t)0x0);
    std::shared_ptr<FileInputSource>::operator=(&this->fis,&local_20);
    std::shared_ptr<FileInputSource>::~shared_ptr(&local_20);
  }
  return;
}

Assistant:

void
ClosedFileInputSource::after()
{
    this->last_offset = this->fis->getLastOffset();
    this->offset = this->fis->tell();
    if (this->stay_open) {
        return;
    }
    this->fis = nullptr;
}